

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

ForStreamable<nonstd::expected_lite::expected<void,_char>,_std::string> * __thiscall
lest::make_string<nonstd::expected_lite::expected<void,char>>
          (ForStreamable<nonstd::expected_lite::expected<void,_char>,_std::string>
           *__return_storage_ptr__,lest *this,expected<void,_char> *item)

{
  char *pcVar1;
  ostringstream os;
  size_type *local_1b0;
  size_type local_1a8;
  size_type local_1a0;
  undefined8 uStack_198;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[expected<void>:",0x10);
  pcVar1 = "[empty]";
  if (this[1] != (lest)0x0) {
    pcVar1 = "[non-empty]";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,pcVar1,(ulong)(byte)this[1] * 4 + 7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"]",1);
  std::__cxx11::stringbuf::str();
  if (local_1b0 == &local_1a0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1a0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_198;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1b0;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1a0;
  }
  __return_storage_ptr__->_M_string_length = local_1a8;
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

auto make_string( T const & item ) -> ForStreamable<T, std::string>
{
    std::ostringstream os; os << item; return os.str();
}